

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O3

void std::
     __move_median_to_first<float*,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,float,float>>>>
               (float *__result,float *__a,float *__b,float *__c,
               _Iter_comp_iter<duckdb::QuantileCompare<duckdb::MadAccessor<float,_float,_float>_>_>
               __comp)

{
  float fVar1;
  bool bVar2;
  float __tmp_1;
  float fVar3;
  float __tmp;
  float fVar4;
  float fVar5;
  
  fVar3 = *(__comp._M_comp.accessor_l)->median;
  fVar1 = *__b;
  fVar5 = *(__comp._M_comp.accessor_r)->median;
  fVar4 = ABS(*__a - fVar3);
  bVar2 = fVar4 < ABS(fVar1 - fVar5);
  if (__comp._M_comp.desc != false) {
    bVar2 = ABS(fVar1 - fVar5) < fVar4;
  }
  if (bVar2) {
    fVar5 = ABS(*__c - fVar5);
    bVar2 = ABS(fVar1 - fVar3) < fVar5;
    if (__comp._M_comp.desc != false) {
      bVar2 = fVar5 < ABS(fVar1 - fVar3);
    }
    if (!bVar2) {
      bVar2 = fVar4 < fVar5;
      if (__comp._M_comp.desc != false) {
        bVar2 = fVar5 < fVar4;
      }
      fVar3 = *__result;
      if (bVar2) {
        *__result = *__c;
        *__c = fVar3;
        return;
      }
LAB_00536716:
      *__result = *__a;
      *__a = fVar3;
      return;
    }
    fVar3 = *__result;
  }
  else {
    fVar5 = ABS(*__c - fVar5);
    bVar2 = fVar4 < fVar5;
    if (__comp._M_comp.desc != false) {
      bVar2 = fVar5 < fVar4;
    }
    if (bVar2) {
      fVar3 = *__result;
      goto LAB_00536716;
    }
    bVar2 = ABS(fVar1 - fVar3) < fVar5;
    if (__comp._M_comp.desc != false) {
      bVar2 = fVar5 < ABS(fVar1 - fVar3);
    }
    fVar3 = *__result;
    if (bVar2) {
      *__result = *__c;
      *__c = fVar3;
      return;
    }
  }
  *__result = fVar1;
  *__b = fVar3;
  return;
}

Assistant:

inline RESULT_TYPE operator()(const INPUT_TYPE &input) const {
		const RESULT_TYPE delta = input - UnsafeNumericCast<RESULT_TYPE>(median);
		return TryAbsOperator::Operation<RESULT_TYPE, RESULT_TYPE>(delta);
	}